

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

int Abc_SclTimeIncUpdate(SC_Man *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vec_Ptr_t *pVVar4;
  long *plVar5;
  Abc_Obj_t *pAVar6;
  SC_Pair *pSVar7;
  SC_Pair *pSVar8;
  void *pvVar9;
  Abc_Obj_t *pNode;
  Vec_Int_t *pVVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  Vec_Int_t *pVVar15;
  Vec_Wec_t *pVVar16;
  SC_Timing *pTime;
  char *__function;
  long lVar17;
  char *__file;
  long lVar18;
  SC_Cell *pCell;
  long lVar19;
  long lVar20;
  float fVar21;
  
  if (p->vChanged->nSize == 0) {
    return 0;
  }
  pVVar15 = p->vChanged;
  if (0 < pVVar15->nSize) {
    lVar19 = 0;
    do {
      iVar14 = pVVar15->pArray[lVar19];
      if (((long)iVar14 < 0) || (pVVar4 = p->pNtk->vObjs, pVVar4->nSize <= iVar14))
      goto LAB_0046f8cb;
      plVar5 = (long *)pVVar4->pArray[iVar14];
      if (plVar5 != (long *)0x0) {
        if (0 < *(int *)((long)plVar5 + 0x1c)) {
          lVar18 = 0;
          do {
            lVar20 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                              (long)*(int *)(plVar5[4] + lVar18 * 4) * 8);
            uVar12 = *(uint *)(lVar20 + 0x14);
            if ((uVar12 & 0xf) != 8 && (char)((uVar12 & 0x40) >> 6) == '\0') {
              *(uint *)(lVar20 + 0x14) = uVar12 | 0x40;
              if (p->vLevels->nSize <= (int)(uVar12 >> 0xc)) goto LAB_0046f8ea;
              Vec_IntPush((Vec_Int_t *)
                          ((long)&p->vLevels->pArray->nCap + (ulong)((uVar12 >> 0xc) << 4)),
                          *(int *)(lVar20 + 0x10));
              p->nIncUpdates = p->nIncUpdates + 1;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < *(int *)((long)plVar5 + 0x1c));
        }
        uVar12 = *(uint *)((long)plVar5 + 0x14);
        if ((uVar12 & 0x40) == 0) {
          if ((uVar12 & 0xf) == 8) {
            __assert_fail("!Abc_ObjIsLatch(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.c"
                          ,0x1c9,"void Abc_SclTimeIncAddNode(SC_Man *, Abc_Obj_t *)");
          }
          *(uint *)((long)plVar5 + 0x14) = uVar12 | 0x40;
          if (p->vLevels->nSize <= (int)(uVar12 >> 0xc)) goto LAB_0046f8ea;
          Vec_IntPush((Vec_Int_t *)((long)&p->vLevels->pArray->nCap + (ulong)((uVar12 >> 0xc) << 4))
                      ,(int)plVar5[2]);
          p->nIncUpdates = p->nIncUpdates + 1;
        }
      }
      lVar19 = lVar19 + 1;
      pVVar15 = p->vChanged;
    } while (lVar19 < pVVar15->nSize);
  }
  pVVar15->nSize = 0;
  pVVar16 = p->vLevels;
  if (0 < pVVar16->nSize) {
    lVar19 = 0;
    do {
      pVVar15 = pVVar16->pArray;
      if (0 < pVVar15[lVar19].nSize) {
        lVar18 = 0;
        do {
          iVar14 = pVVar15[lVar19].pArray[lVar18];
          if (((long)iVar14 < 0) || (pVVar4 = p->pNtk->vObjs, pVVar4->nSize <= iVar14))
          goto LAB_0046f8cb;
          pAVar6 = (Abc_Obj_t *)pVVar4->pArray[iVar14];
          if (pAVar6 != (Abc_Obj_t *)0x0) {
            uVar12 = pAVar6->Id;
            pSVar7 = p->pTimes;
            if ((*(uint *)&pAVar6->field_0x14 & 0xf) - 5 < 0xfffffffe) {
              pSVar8 = p->pSlews;
              fVar21 = pSVar7[uVar12].rise;
              fVar1 = pSVar7[uVar12].fall;
              pSVar7[uVar12].fall = 0.0;
              pSVar7[uVar12].rise = 0.0;
              fVar2 = pSVar8[uVar12].rise;
              fVar3 = pSVar8[uVar12].fall;
              pSVar8[uVar12].rise = 0.0;
              pSVar8[uVar12].fall = 0.0;
              Abc_SclTimeNode(p,pAVar6,0);
              if ((((((0.1 <= fVar21 - pSVar7[uVar12].rise) || (0.1 <= pSVar7[uVar12].rise - fVar21)
                     ) || (0.1 <= fVar1 - pSVar7[uVar12].fall)) ||
                   ((0.1 <= pSVar7[uVar12].fall - fVar1 || (0.1 <= fVar2 - pSVar8[uVar12].rise))))
                  || ((0.1 <= pSVar8[uVar12].rise - fVar2 ||
                      ((0.1 <= fVar3 - pSVar8[uVar12].fall || (0.1 <= pSVar8[uVar12].fall - fVar3)))
                      ))) && (0 < (pAVar6->vFanouts).nSize)) {
                lVar20 = 0;
                do {
                  pvVar9 = pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanouts).pArray[lVar20]];
                  uVar12 = *(uint *)((long)pvVar9 + 0x14);
                  if ((uVar12 & 0xf) != 8 && (char)((uVar12 & 0x40) >> 6) == '\0') {
                    *(uint *)((long)pvVar9 + 0x14) = uVar12 | 0x40;
                    if (p->vLevels->nSize <= (int)(uVar12 >> 0xc)) goto LAB_0046f8ea;
                    Vec_IntPush((Vec_Int_t *)
                                ((long)&p->vLevels->pArray->nCap + (ulong)((uVar12 >> 0xc) << 4)),
                                *(int *)((long)pvVar9 + 0x10));
                    p->nIncUpdates = p->nIncUpdates + 1;
                  }
                  lVar20 = lVar20 + 1;
                } while (lVar20 < (pAVar6->vFanouts).nSize);
              }
            }
            else {
              pSVar7[uVar12] =
                   pSVar7[*(uint *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray] +
                                   0x10)];
              iVar14 = (pAVar6->field_5).iData;
              if (((long)iVar14 < 0) || (p->vTimesOut->nSize <= iVar14)) {
                __file = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                ;
                __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
                goto LAB_0046f8e0;
              }
              fVar21 = p->pTimes[(uint)pAVar6->Id].rise;
              fVar1 = p->pTimes[(uint)pAVar6->Id].fall;
              if (fVar21 <= fVar1) {
                fVar21 = fVar1;
              }
              p->vTimesOut->pArray[iVar14] = fVar21;
              Vec_QueUpdate(p->vQue,(pAVar6->field_5).iData);
            }
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < pVVar15[lVar19].nSize);
      }
      lVar19 = lVar19 + 1;
      pVVar16 = p->vLevels;
    } while (lVar19 < pVVar16->nSize);
  }
  iVar14 = p->vQue->nSize;
  if (0 < iVar14) {
    uVar12 = 0xffffffff;
    if (iVar14 != 1) {
      uVar12 = p->vQue->pHeap[1];
    }
    if ((-1 < (int)uVar12) && (pVVar4 = p->pNtk->vCos, (int)uVar12 < pVVar4->nSize)) {
      uVar12 = *(uint *)((long)pVVar4->pArray[uVar12] + 0x10);
      fVar21 = p->pTimes[uVar12].rise;
      fVar1 = p->pTimes[uVar12].fall;
      if (fVar21 <= fVar1) {
        fVar21 = fVar1;
      }
      p->MaxDelay = fVar21;
      lVar19 = (long)p->vLevels->nSize;
      if (0 < lVar19) {
        do {
          if (p->vLevels->nSize < lVar19) {
LAB_0046f8ea:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          lVar18 = lVar19 + -1;
          pVVar15 = p->vLevels->pArray;
          if (0 < pVVar15[lVar18].nSize) {
            lVar20 = 0;
            do {
              iVar14 = pVVar15[lVar18].pArray[lVar20];
              if (((long)iVar14 < 0) || (pVVar4 = p->pNtk->vObjs, pVVar4->nSize <= iVar14))
              goto LAB_0046f8cb;
              pAVar6 = (Abc_Obj_t *)pVVar4->pArray[iVar14];
              if (pAVar6 != (Abc_Obj_t *)0x0) {
                pSVar7 = p->pDepts;
                uVar12 = pAVar6->Id;
                fVar21 = pSVar7[uVar12].rise;
                fVar1 = pSVar7[uVar12].fall;
                pSVar7[uVar12].rise = 0.0;
                pSVar7[uVar12].fall = 0.0;
                if (0 < (pAVar6->vFanouts).nSize) {
                  lVar17 = 0;
                  do {
                    pNode = (Abc_Obj_t *)
                            pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanouts).pArray[lVar17]];
                    uVar13 = *(uint *)&pNode->field_0x14 & 0xf;
                    if ((8 < uVar13) || ((0x118U >> uVar13 & 1) == 0)) {
                      iVar14 = pNode->Id;
                      if ((long)iVar14 < 0) {
LAB_0046f909:
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                      }
                      pVVar10 = pNode->pNtk->vGates;
                      if (pVVar10->nSize <= iVar14) goto LAB_0046f909;
                      uVar13 = pVVar10->pArray[iVar14];
                      if ((ulong)uVar13 == 0xffffffff) {
                        pCell = (SC_Cell *)0x0;
                      }
                      else {
                        if (((int)uVar13 < 0) ||
                           (pvVar9 = pNode->pNtk->pSCLib,
                           *(int *)((long)pvVar9 + 100) <= (int)uVar13)) goto LAB_0046f8cb;
                        pCell = *(SC_Cell **)(*(long *)((long)pvVar9 + 0x68) + (ulong)uVar13 * 8);
                      }
                      iVar14 = Abc_NodeFindFanin(pNode,pAVar6);
                      pTime = Scl_CellPinTime(pCell,iVar14);
                      Abc_SclDeptFanin(p,pTime,pNode,pAVar6);
                    }
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < (pAVar6->vFanouts).nSize);
                }
                if (((((0.1 <= fVar21 - pSVar7[uVar12].rise) ||
                      (0.1 <= pSVar7[uVar12].rise - fVar21)) || (0.1 <= fVar1 - pSVar7[uVar12].fall)
                     ) || (0.1 <= pSVar7[uVar12].fall - fVar1)) && (0 < (pAVar6->vFanins).nSize)) {
                  lVar17 = 0;
                  do {
                    pvVar9 = pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar17]];
                    uVar12 = *(uint *)((long)pvVar9 + 0x14);
                    if ((uVar12 & 0xf) != 8 && (char)((uVar12 & 0x40) >> 6) == '\0') {
                      *(uint *)((long)pvVar9 + 0x14) = uVar12 | 0x40;
                      if (p->vLevels->nSize <= (int)(uVar12 >> 0xc)) goto LAB_0046f8ea;
                      Vec_IntPush((Vec_Int_t *)
                                  ((long)&p->vLevels->pArray->nCap + (ulong)((uVar12 >> 0xc) << 4)),
                                  *(int *)((long)pvVar9 + 0x10));
                      p->nIncUpdates = p->nIncUpdates + 1;
                    }
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < (pAVar6->vFanins).nSize);
                }
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 < pVVar15[lVar18].nSize);
          }
          bVar11 = 1 < lVar19;
          lVar19 = lVar18;
        } while (bVar11);
      }
      iVar14 = p->vQue->nSize;
      if (iVar14 < 1) goto LAB_0046f97d;
      uVar12 = 0xffffffff;
      if (iVar14 != 1) {
        uVar12 = p->vQue->pHeap[1];
      }
      if ((-1 < (int)uVar12) && (pVVar4 = p->pNtk->vCos, (int)uVar12 < pVVar4->nSize)) {
        uVar12 = *(uint *)((long)pVVar4->pArray[uVar12] + 0x10);
        fVar21 = p->pTimes[uVar12].rise;
        fVar1 = p->pTimes[uVar12].fall;
        if (fVar21 <= fVar1) {
          fVar21 = fVar1;
        }
        pVVar16 = p->vLevels;
        p->MaxDelay = fVar21;
        if (0 < pVVar16->nSize) {
          lVar19 = 0;
          do {
            pVVar15 = pVVar16->pArray;
            if (0 < pVVar15[lVar19].nSize) {
              lVar18 = 0;
              do {
                iVar14 = pVVar15[lVar19].pArray[lVar18];
                if (((long)iVar14 < 0) || (pVVar4 = p->pNtk->vObjs, pVVar4->nSize <= iVar14))
                goto LAB_0046f8cb;
                pvVar9 = pVVar4->pArray[iVar14];
                if (pvVar9 != (void *)0x0) {
                  if ((*(uint *)((long)pvVar9 + 0x14) & 0x40) == 0) {
                    __assert_fail("pObj->fMarkC == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.c"
                                  ,0x1c1,"void Abc_SclTimeIncUpdateClean(SC_Man *)");
                  }
                  *(uint *)((long)pvVar9 + 0x14) = *(uint *)((long)pvVar9 + 0x14) & 0xffffffbf;
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 < pVVar15[lVar19].nSize);
            }
            pVVar15[lVar19].nSize = 0;
            lVar19 = lVar19 + 1;
            pVVar16 = p->vLevels;
          } while (lVar19 < pVVar16->nSize);
        }
        iVar14 = p->nIncUpdates;
        p->nIncUpdates = 0;
        return iVar14;
      }
    }
LAB_0046f8cb:
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h";
    __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
LAB_0046f8e0:
    __assert_fail("i >= 0 && i < p->nSize",__file,0x184,__function);
  }
LAB_0046f97d:
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                ,0x88,"int Vec_QueSize(Vec_Que_t *)");
}

Assistant:

int Abc_SclTimeIncUpdate( SC_Man * p )
{
    Abc_Obj_t * pObj;
    int i, RetValue;
    if ( Vec_IntSize(p->vChanged) == 0 )
        return 0;
//    Abc_SclTimeIncCheckLevel( p->pNtk );
    Abc_NtkForEachObjVec( p->vChanged, p->pNtk, pObj, i )
    {
        Abc_SclTimeIncAddFanins( p, pObj );
        if ( pObj->fMarkC )
            continue;
        Abc_SclTimeIncAddNode( p, pObj );
    }
    Vec_IntClear( p->vChanged );
    Abc_SclTimeIncUpdateArrival( p );
    Abc_SclTimeIncUpdateDeparture( p );
    Abc_SclTimeIncUpdateClean( p );
    RetValue = p->nIncUpdates;
    p->nIncUpdates = 0;
    return RetValue;
}